

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.h
# Opt level: O0

int __thiscall MeCab::Mmap<short>::open(Mmap<short> *this,char *__file,int __oflag,...)

{
  char *pcVar1;
  int iVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  ostream *poVar3;
  undefined7 extraout_var_02;
  char *p;
  int prot;
  stat st;
  whatlog *in_stack_fffffffffffffec8;
  wlog local_118;
  short *local_110;
  int local_104;
  wlog local_100;
  wlog local_f8;
  wlog local_f0 [3];
  allocator local_d1;
  string local_d0 [32];
  stat local_b0;
  char *local_20;
  char *local_18;
  Mmap<short> *local_10;
  bool local_1;
  
  local_20 = ___oflag;
  local_18 = __file;
  local_10 = this;
  close(this,(int)__file);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,pcVar1,&local_d1);
  std::__cxx11::string::operator=((string *)&this->fileName,local_d0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  iVar2 = strcmp(local_20,"r");
  if (iVar2 == 0) {
    this->flag = 0;
  }
  else {
    iVar2 = strcmp(local_20,"r+");
    if (iVar2 != 0) {
      wlog::wlog((wlog *)this,in_stack_fffffffffffffec8);
      poVar3 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/mmap.h"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x9a);
      poVar3 = std::operator<<(poVar3,") [");
      poVar3 = std::operator<<(poVar3,"false");
      poVar3 = std::operator<<(poVar3,"] ");
      poVar3 = std::operator<<(poVar3,"unknown open mode: ");
      poVar3 = std::operator<<(poVar3,local_18);
      local_1 = wlog::operator&(local_f0,poVar3);
      this = (Mmap<short> *)CONCAT71(extraout_var,local_1);
      goto LAB_00152309;
    }
    this->flag = 2;
  }
  iVar2 = ::open(local_18,this->flag);
  this->fd = iVar2;
  if (iVar2 < 0) {
    wlog::wlog((wlog *)this,in_stack_fffffffffffffec8);
    poVar3 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/mmap.h"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x9c);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"(fd = ::open(filename, flag | O_BINARY)) >= 0");
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,"open failed: ");
    poVar3 = std::operator<<(poVar3,local_18);
    local_1 = wlog::operator&(&local_f8,poVar3);
    this = (Mmap<short> *)CONCAT71(extraout_var_00,local_1);
  }
  else {
    iVar2 = fstat(this->fd,&local_b0);
    if (iVar2 < 0) {
      wlog::wlog((wlog *)this,in_stack_fffffffffffffec8);
      poVar3 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/mmap.h"
                              );
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x9f);
      poVar3 = std::operator<<(poVar3,") [");
      poVar3 = std::operator<<(poVar3,"::fstat(fd, &st) >= 0");
      poVar3 = std::operator<<(poVar3,"] ");
      poVar3 = std::operator<<(poVar3,"failed to get file size: ");
      poVar3 = std::operator<<(poVar3,local_18);
      local_1 = wlog::operator&(&local_100,poVar3);
      this = (Mmap<short> *)CONCAT71(extraout_var_01,local_1);
    }
    else {
      this->length = local_b0.st_size;
      local_104 = 1;
      if (this->flag == 2) {
        local_104 = 3;
      }
      local_110 = (short *)mmap((void *)0x0,this->length,local_104,1,this->fd,0);
      if (local_110 == (short *)0xffffffffffffffff) {
        wlog::wlog((wlog *)this,in_stack_fffffffffffffec8);
        poVar3 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/mmap.h"
                                );
        poVar3 = std::operator<<(poVar3,"(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xaa);
        poVar3 = std::operator<<(poVar3,") [");
        poVar3 = std::operator<<(poVar3,
                                 "(p = reinterpret_cast<char *> (::mmap(0, length, prot, MAP_SHARED, fd, 0))) != MAP_FAILED"
                                );
        poVar3 = std::operator<<(poVar3,"] ");
        poVar3 = std::operator<<(poVar3,"mmap() failed: ");
        poVar3 = std::operator<<(poVar3,local_18);
        local_1 = wlog::operator&(&local_118,poVar3);
        this = (Mmap<short> *)CONCAT71(extraout_var_02,local_1);
      }
      else {
        this->text = local_110;
        ::close(this->fd);
        this->fd = -1;
        local_1 = true;
      }
    }
  }
LAB_00152309:
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool open(const char *filename, const char *mode = "r") {
    this->close();
    struct stat st;
    fileName = std::string(filename);

    if      (std::strcmp(mode, "r") == 0)
      flag = O_RDONLY;
    else if (std::strcmp(mode, "r+") == 0)
      flag = O_RDWR;
    else
      CHECK_FALSE(false) << "unknown open mode: " << filename;

    CHECK_FALSE((fd = ::open(filename, flag | O_BINARY)) >= 0)
        << "open failed: " << filename;

    CHECK_FALSE(::fstat(fd, &st) >= 0)
        << "failed to get file size: " << filename;

    length = st.st_size;

#ifdef HAVE_MMAP
    int prot = PROT_READ;
    if (flag == O_RDWR) prot |= PROT_WRITE;
    char *p;
    CHECK_FALSE((p = reinterpret_cast<char *>
                 (::mmap(0, length, prot, MAP_SHARED, fd, 0)))
                      != MAP_FAILED)
        << "mmap() failed: " << filename;

    text = reinterpret_cast<T *>(p);
#else
    text = new T[length];
    CHECK_FALSE(::read(fd, text, length) >= 0)
        << "read() failed: " << filename;
#endif
    ::close(fd);
    fd = -1;

    return true;
  }